

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O2

double __thiscall Net::accuracy(Net *this,Table *Xtest,Table *Ytest)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int l_row;
  int iVar4;
  int r_row;
  bool bVar5;
  double dVar6;
  double dVar7;
  Table local_100;
  Table local_98;
  
  iVar1 = Table::get_rows(Xtest);
  iVar4 = 0;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  dVar6 = 0.0;
  l_row = 0;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    iVar2 = Table::get_cols(Xtest);
    r_row = l_row + 1;
    Table::slice(&local_98,Xtest,0,iVar2,l_row,r_row);
    iVar2 = predict(this,&local_98);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::operator<<(poVar3,' ');
    dVar7 = Table::get_value(Ytest,0,l_row);
    poVar3 = std::ostream::_M_insert<double>(dVar7);
    std::operator<<(poVar3,'\n');
    Table::~Table(&local_98);
    iVar2 = Table::get_cols(Xtest);
    Table::slice(&local_100,Xtest,0,iVar2,l_row,r_row);
    iVar2 = predict(this,&local_100);
    dVar7 = Table::get_value(Ytest,0,l_row);
    Table::~Table(&local_100);
    dVar6 = (double)(~-(ulong)(dVar7 == (double)iVar2) & (ulong)dVar6 |
                    (ulong)(dVar6 + 1.0) & -(ulong)(dVar7 == (double)iVar2));
    l_row = r_row;
  }
  return dVar6 / (double)iVar1;
}

Assistant:

double Net::accuracy(Table &Xtest, Table &Ytest) {
    int tests = Xtest.get_rows();
    double TrueAnswers = 0;
    for (int i = 0; i < tests; ++i){
        std::cout << predict(Xtest.slice(0, Xtest.get_cols(), i, i + 1)) << ' ' << Ytest.get_value(0, i) << '\n';
        if (predict(Xtest.slice(0, Xtest.get_cols(), i, i + 1)) == Ytest.get_value(0, i))
            TrueAnswers++;
    }
    return TrueAnswers / (double)tests;
}